

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void greet_prog_necro_skull(CHAR_DATA *mob,CHAR_DATA *ch)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char buf [4608];
  char acStack_1228 [4616];
  
  ch_00 = mob->leader;
  if (ch_00 != ch) {
    bVar1 = can_see(ch_00,ch);
    if (bVar1) {
      bVar1 = is_npc(ch);
      if (!bVar1) {
        act("$n rises into the air and opens its mouth in a silent shriek!",mob,(void *)0x0,ch,0);
        pcVar2 = get_char_color(ch,"lightred");
        pcVar3 = palloc_string(ch->name);
        pcVar4 = END_COLOR(ch);
        sprintf(acStack_1228,
                "A skull-sentinel whispers to you \'%sMaster, %s has arrived at my location.%s\'",
                pcVar2,pcVar3,pcVar4);
        act(acStack_1228,ch_00,(void *)0x0,(void *)0x0,3);
      }
    }
  }
  return;
}

Assistant:

void greet_prog_necro_skull(CHAR_DATA *mob, CHAR_DATA *ch)
{
	char buf[MSL];
	CHAR_DATA *master = mob->leader;

	if (ch == master)
		return;

	if (!can_see(master, ch))
		return;

	if (is_npc(ch))
		return;

	act("$n rises into the air and opens its mouth in a silent shriek!", mob, 0, ch, TO_ROOM);
	sprintf(buf, "A skull-sentinel whispers to you '%sMaster, %s has arrived at my location.%s'",
		get_char_color(ch, "lightred"),
		palloc_string(ch->name),
		END_COLOR(ch));
	act(buf, master, 0, 0, TO_CHAR);
}